

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

BcOp relop_invert(BcOp relop)

{
  if (relop - BC_EQ_LL < 0xe) {
    return *(BcOp *)(&DAT_0012a700 + (ulong)(relop - BC_EQ_LL) * 4);
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                ,0x161,"BcOp relop_invert(BcOp)");
}

Assistant:

static BcOp relop_invert(BcOp relop) {
	switch (relop) {
		case BC_EQ_LL:  return BC_NEQ_LL;
		case BC_EQ_LN:  return BC_NEQ_LN;
		case BC_EQ_LP:  return BC_NEQ_LP;
		case BC_NEQ_LL: return BC_EQ_LL;
		case BC_NEQ_LN: return BC_EQ_LN;
		case BC_NEQ_LP: return BC_EQ_LP;
		case BC_LT_LL:  return BC_GE_LL;
		case BC_LT_LN:  return BC_GE_LN;
		case BC_LE_LL:  return BC_GT_LL;
		case BC_LE_LN:  return BC_GT_LN;
		case BC_GT_LL:  return BC_LE_LL;
		case BC_GT_LN:  return BC_LE_LN;
		case BC_GE_LL:  return BC_LT_LL;
		case BC_GE_LN:  return BC_LT_LN;
		default: UNREACHABLE();
	}
}